

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::
~HelperInvocationDerivateCase(HelperInvocationDerivateCase *this)

{
  ~HelperInvocationDerivateCase(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

HelperInvocationDerivateCase::~HelperInvocationDerivateCase (void)
{
	deinit();
}